

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util_test.cc
# Opt level: O2

void __thiscall
FileTest_Get_File_Size_Test::FileTest_Get_File_Size_Test(FileTest_Get_File_Size_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0014d038;
  return;
}

Assistant:

TEST(FileTest, Get_File_Size) {
#ifndef _MSC_VER
  std::string filename = "/tmp/test";
#else
  std::string filename = "../../test";
#endif
  FILE* file_w = OpenFileOrDie(filename.c_str(), "w");
  int number = 999;
  WriteDataToDisk(file_w, (char*)&number, sizeof(number));
  uint64 size = GetFileSize(file_w);
  EXPECT_EQ(size, 4);
  Close(file_w);
  RemoveFile(filename.c_str());
}